

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizationCreator.hpp
# Opt level: O1

void __thiscall OpenMD::OptimizationCreator::~OptimizationCreator(OptimizationCreator *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_OptimizationCreator = (_func_int **)&PTR__OptimizationCreator_00303898;
  pcVar1 = (this->ident_)._M_dataplus._M_p;
  paVar2 = &(this->ident_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~OptimizationCreator() {}